

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarray.h
# Opt level: O2

void ** tommy_array_ref(tommy_array *array,tommy_count_t pos)

{
  uint uVar1;
  long in_FS_OFFSET;
  
  if (array->count <= pos) {
    __assert_fail("pos < array->count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommyarray.h"
                  ,0x61,"void **tommy_array_ref(tommy_array *, tommy_count_t)");
  }
  uVar1 = 0x1f;
  if ((pos | 1) != 0) {
    for (; (pos | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return array->bucket[uVar1] + pos;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void** tommy_array_ref(tommy_array* array, tommy_count_t pos)
{
	tommy_uint_t bsr;

	assert(pos < array->count);

	/* get the highest bit set, in case of all 0, return 0 */
	bsr = tommy_ilog2_u32(pos | 1);

	return &array->bucket[bsr][pos];
}